

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ROMInfo.cpp
# Opt level: O2

ROMImage * MT32Emu::ROMImage::makeROMImage(File *file)

{
  ROMImage *this;
  
  this = (ROMImage *)operator_new(0x18);
  getROMInfoLists();
  ROMImage(this,file,false,getROMInfoLists::ALL_ROM_INFOS);
  return this;
}

Assistant:

const ROMImage *ROMImage::makeROMImage(File *file) {
	return new ROMImage(file, false, getKnownROMInfoList());
}